

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basewindow_x11.cc
# Opt level: O0

void __thiscall
bgui::PaintBufferFct::PaintBufferFct
          (PaintBufferFct *this,BaseWindowData *_p,ImageAdapterBase *_im,int _x,int _y)

{
  int iVar1;
  long *plVar2;
  undefined4 in_ECX;
  _func_int **in_RDX;
  _func_int **in_RSI;
  ParallelFunction *in_RDI;
  undefined4 in_R8D;
  long local_30;
  long local_28;
  undefined4 local_20;
  undefined4 local_1c;
  _func_int **local_18;
  _func_int **local_10;
  
  local_20 = in_R8D;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  gutil::ParallelFunction::ParallelFunction(in_RDI);
  in_RDI->_vptr_ParallelFunction = (_func_int **)&PTR_run_001c5328;
  in_RDI[1]._vptr_ParallelFunction = local_10;
  in_RDI[2]._vptr_ParallelFunction = local_18;
  *(undefined4 *)&in_RDI[3]._vptr_ParallelFunction = local_1c;
  *(undefined4 *)((long)&in_RDI[3]._vptr_ParallelFunction + 4) = local_20;
  anon_unknown_0::getShiftFromMask
            (*(unsigned_long *)(in_RDI[1]._vptr_ParallelFunction[8] + 0x38),(int *)(in_RDI + 4),
             (int *)((long)&in_RDI[4]._vptr_ParallelFunction + 4));
  anon_unknown_0::getShiftFromMask
            (*(unsigned_long *)(in_RDI[1]._vptr_ParallelFunction[8] + 0x40),(int *)(in_RDI + 5),
             (int *)((long)&in_RDI[5]._vptr_ParallelFunction + 4));
  anon_unknown_0::getShiftFromMask
            (*(unsigned_long *)(in_RDI[1]._vptr_ParallelFunction[8] + 0x48),(int *)(in_RDI + 6),
             (int *)((long)&in_RDI[6]._vptr_ParallelFunction + 4));
  local_28 = (long)*(int *)in_RDI[1]._vptr_ParallelFunction[8];
  iVar1 = *(int *)&in_RDI[3]._vptr_ParallelFunction;
  local_30 = (**(code **)(*in_RDI[2]._vptr_ParallelFunction + 0x58))();
  local_30 = iVar1 + local_30;
  plVar2 = std::min<long>(&local_28,&local_30);
  *(int *)&in_RDI[7]._vptr_ParallelFunction = (int)*plVar2;
  return;
}

Assistant:

PaintBufferFct(BaseWindowData *_p, const ImageAdapterBase &_im, int _x, int _y) :
      p(_p), im(_im), x(_x), y(_y)
    {
      // store image in buffer

      getShiftFromMask(p->image->red_mask, rls, rrs);
      getShiftFromMask(p->image->green_mask, gls, grs);
      getShiftFromMask(p->image->blue_mask, bls, brs);

      w=std::min(static_cast<long>(p->image->width), x+im.getWidth());
    }